

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O1

void __thiscall
ConfidentialTransaction_SetUnlockingScriptTest_Test::TestBody
          (ConfidentialTransaction_SetUnlockingScriptTest_Test *this)

{
  Script *object;
  AssertHelperData *pAVar1;
  undefined8 lhs;
  bool bVar2;
  _func_int *message;
  char *pcVar3;
  uint32_t index;
  ByteData exp_data2;
  AssertionResult gtest_ar_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> exp_list;
  ByteData exp_data1;
  ConfidentialTransaction tx;
  ConfidentialTxInReference txin_ref;
  uint local_3a4;
  undefined1 local_3a0 [32];
  ByteData local_380;
  internal local_368 [8];
  undefined8 *local_360;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_358;
  string local_340;
  undefined1 local_320 [40];
  uint32_t local_2f8;
  Script local_2f0;
  uint32_t local_2b8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_278;
  ConfidentialValue CStack_260;
  ConfidentialValue CStack_238;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_210;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_1f8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> vStack_1d8;
  ConfidentialTransaction local_1c0;
  ConfidentialTxInReference local_180;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&local_1c0,&exp_tx_hex_abi_cxx11_);
  local_3a4 = 0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3a4 = cfd::core::ConfidentialTransaction::AddTxIn
                            (&local_1c0,&exp_txid,2,0xfffffffe,(Script *)cfd::core::Script::Empty);
    }
  }
  else {
    testing::Message::Message((Message *)&local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x24c,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_320,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_320);
    if (local_180.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_180.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*local_180.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
      }
      local_180.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x0;
    }
  }
  local_320._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_180,"index","1",&local_3a4,(int *)local_320);
  if ((char)local_180.super_AbstractTxInReference._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_320);
    if (local_180.super_AbstractTxInReference.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x5bc76e;
    }
    else {
      message = *local_180.super_AbstractTxInReference.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x24d,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_320._0_8_ + 8))();
      }
      local_320._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_180.super_AbstractTxInReference.txid_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetUnlockingScript(&local_1c0,local_3a4 + 5,&exp_script);
  }
  testing::Message::Message((Message *)&local_180);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_320,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x250,
             "Expected: (tx.SetUnlockingScript(index + 5, exp_script)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_320,(Message *)&local_180);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_320);
  if (local_180.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_180.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
      (**(code **)(*local_180.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
    }
    local_180.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript(&local_1c0,local_3a4,&exp_script);
    }
  }
  else {
    testing::Message::Message((Message *)&local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x251,
               "Expected: (tx.SetUnlockingScript(index, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_320,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_320);
    if (local_180.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_180.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*local_180.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
      }
      local_180.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x0;
    }
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&local_180);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)local_320,&local_1c0,1);
      cfd::core::Txid::operator=
                (&local_180.super_AbstractTxInReference.txid_,(Txid *)(local_320 + 8));
      local_180.super_AbstractTxInReference.vout_ = local_2f8;
      cfd::core::Script::operator=
                (&local_180.super_AbstractTxInReference.unlocking_script_,&local_2f0);
      local_180.super_AbstractTxInReference.sequence_ = local_2b8;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_180.super_AbstractTxInReference.script_witness_.witness_stack_,&local_2a8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.blinding_nonce_.data_,&vStack_290);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.asset_entropy_.data_,&vStack_278);
      cfd::core::ConfidentialValue::operator=(&local_180.issuance_amount_,&CStack_260);
      cfd::core::ConfidentialValue::operator=(&local_180.inflation_keys_,&CStack_238);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.issuance_amount_rangeproof_.data_,&vStack_210);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.inflation_keys_rangeproof_.data_,&vStack_1f8);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_180.pegin_witness_.witness_stack_,&vStack_1d8);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_320);
    }
  }
  else {
    testing::Message::Message((Message *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x254,
               "Expected: (txin_ref = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_320._0_8_ + 8))();
      }
      local_320._0_8_ = (AssertHelperData *)0x0;
    }
  }
  object = &local_180.super_AbstractTxInReference.unlocking_script_;
  cfd::core::Script::Script((Script *)local_320,object);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_3a0,(Script *)local_320);
  lhs = local_3a0._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_(&local_340,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_380,"txin_ref.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)lhs,local_340._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_3a0._0_8_ != (AssertHelperData *)(local_3a0 + 0x10)) {
    operator_delete((void *)local_3a0._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_320);
  if (local_380.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_320);
    if (local_380.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_380.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x256,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_320._0_8_ + 8))();
      }
      local_320._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar1 = (AssertHelperData *)(local_320 + 0x10);
  local_320._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"1234567890","");
  cfd::core::ByteData::ByteData((ByteData *)&local_340,(string *)local_320);
  if ((AssertHelperData *)local_320._0_8_ != pAVar1) {
    operator_delete((void *)local_320._0_8_);
  }
  local_320._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"1234567890123456789012345678901234567890","");
  cfd::core::ByteData::ByteData(&local_380,(string *)local_320);
  if ((AssertHelperData *)local_320._0_8_ != pAVar1) {
    operator_delete((void *)local_320._0_8_);
  }
  local_358.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&local_358,(value_type *)&local_340);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&local_358,&local_380);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetUnlockingScript(&local_1c0,local_3a4 + 5,&local_358);
  }
  testing::Message::Message((Message *)local_320);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x25e,
             "Expected: (tx.SetUnlockingScript(index + 5, exp_list)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_320);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
  if ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_320._0_8_ + 8))();
    }
    local_320._0_8_ = (AssertHelperData *)0x0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript(&local_1c0,local_3a4,&local_358);
    }
  }
  else {
    testing::Message::Message((Message *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x25f,
               "Expected: (tx.SetUnlockingScript(index, exp_list)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_320._0_8_ + 8))();
      }
      local_320._0_8_ = (AssertHelperData *)0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)local_320,&local_1c0,1);
      cfd::core::Txid::operator=
                (&local_180.super_AbstractTxInReference.txid_,(Txid *)(local_320 + 8));
      local_180.super_AbstractTxInReference.vout_ = local_2f8;
      cfd::core::Script::operator=(object,&local_2f0);
      local_180.super_AbstractTxInReference.sequence_ = local_2b8;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_180.super_AbstractTxInReference.script_witness_.witness_stack_,&local_2a8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.blinding_nonce_.data_,&vStack_290);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.asset_entropy_.data_,&vStack_278);
      cfd::core::ConfidentialValue::operator=(&local_180.issuance_amount_,&CStack_260);
      cfd::core::ConfidentialValue::operator=(&local_180.inflation_keys_,&CStack_238);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.issuance_amount_rangeproof_.data_,&vStack_210);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_180.inflation_keys_rangeproof_.data_,&vStack_1f8);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_180.pegin_witness_.witness_stack_,&vStack_1d8);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_320);
    }
  }
  else {
    testing::Message::Message((Message *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x261,
               "Expected: (txin_ref = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_320._0_8_ + 8))();
      }
      local_320._0_8_ = (AssertHelperData *)0x0;
    }
  }
  cfd::core::Script::Script((Script *)local_320,object);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_3a0,(Script *)local_320);
  testing::internal::CmpHelperSTREQ
            (local_368,"txin_ref.GetUnlockingScript().GetHex().c_str()",
             "\"051234567890141234567890123456789012345678901234567890\"",(char *)local_3a0._0_8_,
             "051234567890141234567890123456789012345678901234567890");
  if ((AssertHelperData *)local_3a0._0_8_ != (AssertHelperData *)(local_3a0 + 0x10)) {
    operator_delete((void *)local_3a0._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_320);
  if (local_368[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_320);
    if (local_360 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_360;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x263,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_320._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_320._0_8_ + 8))();
      }
      local_320._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_368 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_358);
  if ((void *)CONCAT71(local_380.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_380.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_380.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_380.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_340._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_180);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_1c0);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetUnlockingScriptTest) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));
  EXPECT_EQ(index, 1);

  // SetUnlockingScript
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_script)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_script)));

  ConfidentialTxInReference txin_ref;
  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());

  // SetUnlockingScript2
  const ByteData exp_data1("1234567890");
  const ByteData exp_data2("1234567890123456789012345678901234567890");
  std::vector<ByteData> exp_list;
  exp_list.push_back(exp_data1);
  exp_list.push_back(exp_data2);
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_list)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_list)));

  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               "051234567890141234567890123456789012345678901234567890");
}